

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_contents(char *name)

{
  size_t sVar1;
  char *in_RDI;
  size_t res;
  FILE *f;
  char *buf;
  size_t size;
  size_t *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  if ((in_RDI != (char *)0x0) && (sVar1 = strlen(in_RDI), sVar1 != 0)) {
    get_filesize(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return (char *)0x0;
}

Assistant:

char *get_contents(const char *name)
{
	if (name == NULL || strlen(name) == 0)
	{
		return NULL;
	}
	size_t size = 0;
	if (get_filesize(name, &size) == false)
	{
		return NULL;
	}
	if (size == 0)
	{
		return NULL;
	}
	char *buf = (char *)malloc(sizeof(char) * size + 1);
	memset(buf, 0x00, sizeof(char) * size + 1);
	FILE *f = fopen(name, "rb");
	if (f == NULL)
	{
		free(buf);
		return NULL;
	}
	if ((getc(f) & 0xFF) != 0xEF || (getc(f) & 0xFF) != 0xBB || (getc(f) & 0xFF) != 0xBF)
	{
		fseek(f, 0, SEEK_SET);
	}
	size_t  res = fread(buf, sizeof(char), size, f);
	if ( res < size)
	{
		fclose(f);
		return buf;
	}
	fclose(f);
	return buf;
}